

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_wrt.c
# Opt level: O0

_Bool tool_create_output_file(OutStruct *outs,OperationConfig *config)

{
  char *__file;
  GlobalConfig *config_00;
  size_t __n;
  int *piVar1;
  char *pcVar2;
  bool bVar3;
  char *newname;
  size_t newlen;
  size_t len;
  int next_num;
  int fd;
  char *fname;
  FILE *file;
  GlobalConfig *global;
  OperationConfig *config_local;
  OutStruct *outs_local;
  
  fname = (char *)0x0;
  __file = outs->filename;
  config_00 = config->global;
  if ((config->file_clobber_mode == CLOBBER_ALWAYS) ||
     ((config->file_clobber_mode == CLOBBER_DEFAULT && (((byte)outs->field_0x8 >> 1 & 1) == 0)))) {
    fname = (char *)fopen64(__file,"wb");
    goto LAB_0010d44f;
  }
  do {
    len._4_4_ = open64(__file,0xc1,0x1b6);
    bVar3 = false;
    if (len._4_4_ == -1) {
      piVar1 = __errno_location();
      bVar3 = *piVar1 == 4;
    }
  } while (bVar3);
  if ((config->file_clobber_mode == CLOBBER_NEVER) && (len._4_4_ == -1)) {
    len._0_4_ = 1;
    __n = strlen(__file);
    if (__n + 0xd < __n) {
      errorf(config_00,"overflow in filename generation");
      return false;
    }
    pcVar2 = (char *)malloc(__n + 0xd);
    if (pcVar2 == (char *)0x0) {
      errorf(config_00,"out of memory");
      return false;
    }
    memcpy(pcVar2,__file,__n);
    pcVar2[__n] = '.';
    do {
      bVar3 = false;
      if (len._4_4_ == -1) {
        piVar1 = __errno_location();
        if (*piVar1 != 0x11) {
          piVar1 = __errno_location();
          bVar3 = false;
          if (*piVar1 != 0x15) goto LAB_0010d397;
        }
        bVar3 = (int)len < 100;
      }
LAB_0010d397:
      if (!bVar3) goto LAB_0010d408;
      curl_msnprintf(pcVar2 + __n + 1,0xc,"%d",(int)len);
      len._0_4_ = (int)len + 1;
      do {
        len._4_4_ = open64(pcVar2,0xc1,0x1b6);
        bVar3 = false;
        if (len._4_4_ == -1) {
          piVar1 = __errno_location();
          bVar3 = *piVar1 == 4;
        }
      } while (bVar3);
    } while( true );
  }
LAB_0010d423:
  if ((len._4_4_ != -1) && (fname = (char *)fdopen(len._4_4_,"wb"), (FILE *)fname == (FILE *)0x0)) {
    close(len._4_4_);
  }
LAB_0010d44f:
  if (fname != (char *)0x0) {
    outs->field_0x8 = outs->field_0x8 & 0xfb | 4;
    outs->field_0x8 = outs->field_0x8 & 0xf7 | 8;
    outs->stream = (FILE *)fname;
    outs->bytes = 0;
    outs->init = 0;
  }
  else {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    warnf(config_00,"Failed to open the file %s: %s",__file,pcVar2);
  }
  return fname != (char *)0x0;
LAB_0010d408:
  outs->filename = pcVar2;
  outs->field_0x8 = outs->field_0x8 & 0xfe | 1;
  goto LAB_0010d423;
}

Assistant:

bool tool_create_output_file(struct OutStruct *outs,
                             struct OperationConfig *config)
{
  struct GlobalConfig *global;
  FILE *file = NULL;
  const char *fname = outs->filename;
  DEBUGASSERT(outs);
  DEBUGASSERT(config);
  global = config->global;
  DEBUGASSERT(fname && *fname);

  if(config->file_clobber_mode == CLOBBER_ALWAYS ||
     (config->file_clobber_mode == CLOBBER_DEFAULT &&
      !outs->is_cd_filename)) {
    /* open file for writing */
    file = fopen(fname, "wb");
  }
  else {
    int fd;
    do {
      fd = open(fname, O_CREAT | O_WRONLY | O_EXCL | CURL_O_BINARY, OPENMODE);
      /* Keep retrying in the hope that it is not interrupted sometime */
      /* !checksrc! disable ERRNOVAR 1 */
    } while(fd == -1 && errno == EINTR);
    if(config->file_clobber_mode == CLOBBER_NEVER && fd == -1) {
      int next_num = 1;
      size_t len = strlen(fname);
      size_t newlen = len + 13; /* nul + 1-11 digits + dot */
      char *newname;
      /* Guard against wraparound in new filename */
      if(newlen < len) {
        errorf(global, "overflow in filename generation");
        return FALSE;
      }
      newname = malloc(newlen);
      if(!newname) {
        errorf(global, "out of memory");
        return FALSE;
      }
      memcpy(newname, fname, len);
      newname[len] = '.';
      /* !checksrc! disable ERRNOVAR 1 */
      while(fd == -1 && /* have not successfully opened a file */
            (errno == EEXIST || errno == EISDIR) &&
            /* because we keep having files that already exist */
            next_num < 100 /* and we have not reached the retry limit */ ) {
        msnprintf(newname + len + 1, 12, "%d", next_num);
        next_num++;
        do {
          fd = open(newname, O_CREAT | O_WRONLY | O_EXCL | CURL_O_BINARY,
                             OPENMODE);
          /* Keep retrying in the hope that it is not interrupted sometime */
        } while(fd == -1 && errno == EINTR);
      }
      outs->filename = newname; /* remember the new one */
      outs->alloc_filename = TRUE;
    }
    /* An else statement to not overwrite existing files and not retry with
       new numbered names (which would cover
       config->file_clobber_mode == CLOBBER_DEFAULT && outs->is_cd_filename)
       is not needed because we would have failed earlier, in the while loop
       and `fd` would now be -1 */
    if(fd != -1) {
      file = fdopen(fd, "wb");
      if(!file)
        close(fd);
    }
  }

  if(!file) {
    warnf(global, "Failed to open the file %s: %s", fname,
          strerror(errno));
    return FALSE;
  }
  outs->s_isreg = TRUE;
  outs->fopened = TRUE;
  outs->stream = file;
  outs->bytes = 0;
  outs->init = 0;
  return TRUE;
}